

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O3

void __thiscall baryonyx::to_log<>(baryonyx *this,FILE *os,uint indent,string_view fmt)

{
  undefined1 auVar1 [16];
  undefined4 in_register_00000014;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  char *local_48 [2];
  ulong local_38;
  
  format_str_00.size_._4_4_ = in_register_00000014;
  format_str_00.size_._0_4_ = indent;
  local_38 = (ulong)os & 0xffffffff;
  local_48[0] = "";
  format_str.size_ = 5;
  format_str.data_ = "{:{}}";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x2c;
  ::fmt::v7::vprint((FILE *)this,format_str,args);
  local_48[0] = (char *)0x0;
  format_str_00.data_ = (char *)fmt._M_len;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_48;
  ::fmt::v7::vprint((FILE *)this,format_str_00,(format_args)(auVar1 << 0x40));
  return;
}

Assistant:

void
to_log([[maybe_unused]] std::FILE* os,
       [[maybe_unused]] unsigned indent,
       [[maybe_unused]] const std::string_view fmt,
       [[maybe_unused]] const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
#ifdef BARYONYX_ENABLE_DEBUG
    fmt::print(os, "{:{}}", "", indent);
    fmt::print(os, fmt, args...);
#endif
#endif
}